

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioApi.c
# Opt level: O0

char * Mio_GateReadPinName(Mio_Gate_t *pGate,int iPin)

{
  char *pcVar1;
  int local_2c;
  Mio_Pin_t *pMStack_28;
  int i;
  Mio_Pin_t *pPin;
  int iPin_local;
  Mio_Gate_t *pGate_local;
  
  local_2c = 0;
  pMStack_28 = Mio_GateReadPins(pGate);
  while( true ) {
    if (pMStack_28 == (Mio_Pin_t *)0x0) {
      return (char *)0x0;
    }
    if (local_2c == iPin) break;
    pMStack_28 = Mio_PinReadNext(pMStack_28);
    local_2c = local_2c + 1;
  }
  pcVar1 = Mio_PinReadName(pMStack_28);
  return pcVar1;
}

Assistant:

char * Mio_GateReadPinName( Mio_Gate_t * pGate, int iPin )
{
    Mio_Pin_t * pPin;
    int i = 0;
    Mio_GateForEachPin( pGate, pPin )
        if ( i++ == iPin )
            return Mio_PinReadName(pPin);
    return NULL;
}